

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

int absl::lts_20250127::GenericCompare<int,absl::lts_20250127::Cord>
              (Cord *lhs,Cord *rhs,size_t size_to_compare)

{
  int iVar1;
  ulong __n;
  bool bVar2;
  string_view sVar3;
  string_view sVar4;
  
  sVar3 = Cord::GetFirstChunk(lhs);
  sVar4 = Cord::GetFirstChunk(rhs);
  __n = sVar3._M_len;
  if (sVar4._M_len < sVar3._M_len) {
    __n = sVar4._M_len;
  }
  if (__n <= size_to_compare) {
    iVar1 = memcmp(sVar3._M_str,sVar4._M_str,__n);
    bVar2 = iVar1 != 0;
    if (__n != size_to_compare && !bVar2) {
      iVar1 = Cord::CompareSlowPath(lhs,rhs,__n,size_to_compare);
      bVar2 = iVar1 != 0;
    }
    return (uint)bVar2 | iVar1 >> 0x1f;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x3d7,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = int, RHS = absl::Cord]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = ::memcmp(lhs_chunk.data(), rhs_chunk.data(), compared_size);
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}